

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

bool __thiscall
QtPrivate::QCalendarTextNavigator::eventFilter(QCalendarTextNavigator *this,QObject *o,QEvent *e)

{
  StandardKey SVar1;
  bool bVar2;
  Type TVar3;
  int iVar4;
  qsizetype qVar5;
  ulong uVar6;
  socklen_t *in_RCX;
  QEvent *in_RDX;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *extraout_RDX_02;
  sockaddr *__addr;
  StandardKey __fd;
  QCalendarTextNavigator *in_RSI;
  QCalendarTextNavigator *in_RDI;
  long in_FS_OFFSET;
  QKeyEvent *ke;
  undefined5 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7d;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  byte bVar7;
  undefined1 uVar8;
  undefined7 in_stack_ffffffffffffff88;
  byte bVar9;
  QCalendar cal;
  QKeyEvent *this_00;
  bool local_49;
  QCalendarTextNavigator *in_stack_ffffffffffffffd0;
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI->m_widget != (QWidget *)0x0) &&
     ((TVar3 = QEvent::type(in_RDX), TVar3 == KeyPress ||
      (TVar3 = QEvent::type(in_RDX), TVar3 == KeyRelease)))) {
    SVar1 = (StandardKey)in_RDX;
    __fd = SVar1;
    this_00 = (QKeyEvent *)in_RDX;
    QKeyEvent::text((QKeyEvent *)
                    CONCAT17(in_stack_ffffffffffffff7f,
                             CONCAT16(in_stack_ffffffffffffff7e,
                                      CONCAT15(in_stack_ffffffffffffff7d,in_stack_ffffffffffffff78))
                            ));
    qVar5 = QString::size(&local_20);
    bVar9 = 0;
    if (qVar5 < 1) {
LAB_0051820e:
      bVar7 = in_RDI->m_dateFrame != (QFrame *)0x0;
    }
    else {
      QKeyEvent::text((QKeyEvent *)
                      CONCAT17(in_stack_ffffffffffffff7f,
                               CONCAT16(in_stack_ffffffffffffff7e,
                                        CONCAT15(in_stack_ffffffffffffff7d,in_stack_ffffffffffffff78
                                                ))));
      bVar9 = 1;
      __fd = UnknownKey;
      QString::at((QString *)CONCAT17(1,in_stack_ffffffffffffff88),(qsizetype)in_RDI);
      bVar2 = QChar::isPrint((QChar *)0x518201);
      in_RCX = (socklen_t *)CONCAT71((int7)((ulong)in_RCX >> 8),bVar2);
      bVar7 = true;
      if (!bVar2) goto LAB_0051820e;
    }
    uVar8 = bVar7;
    if ((bVar9 & 1) != 0) {
      QString::~QString((QString *)0x51823a);
    }
    QString::~QString((QString *)0x518244);
    if ((bVar7 & 1) != 0) {
      iVar4 = QKeyEvent::key((QKeyEvent *)in_RDX);
      if (((iVar4 == 0x1000004) || (iVar4 = QKeyEvent::key((QKeyEvent *)in_RDX), iVar4 == 0x1000005)
          ) || (iVar4 = QKeyEvent::key((QKeyEvent *)in_RDX), iVar4 == 0x1010000)) {
        applyDate((QCalendarTextNavigator *)
                  CONCAT17(uVar8,CONCAT16(bVar7,CONCAT15(in_stack_ffffffffffffff7d,
                                                         in_stack_ffffffffffffff78))));
        editingFinished((QCalendarTextNavigator *)0x518298);
        removeDateLabel(in_RDI);
        __addr = extraout_RDX;
      }
      else {
        __fd = Cancel;
        uVar6 = QKeyEvent::matches(SVar1);
        if ((uVar6 & 1) == 0) {
          TVar3 = QEvent::type((QEvent *)this_00);
          cal = SUB81(this_00,0);
          __addr = extraout_RDX_01;
          if (TVar3 == KeyPress) {
            createDateLabel(in_stack_ffffffffffffffd0);
            __fd = SVar1;
            QCalendarDateValidator::handleKeyEvent
                      ((QCalendarDateValidator *)CONCAT17(bVar9,in_stack_ffffffffffffff88),
                       (QKeyEvent *)in_RDI,cal);
            updateDateLabel(in_RSI);
            __addr = extraout_RDX_02;
          }
        }
        else {
          removeDateLabel(in_RDI);
          __addr = extraout_RDX_00;
        }
      }
      QEvent::accept(in_RDX,__fd,__addr,in_RCX);
      local_49 = true;
      goto LAB_0051833c;
    }
  }
  bVar9 = QObject::eventFilter(&in_RDI->super_QObject,(QEvent *)in_RSI);
  local_49 = (bool)(bVar9 & 1);
LAB_0051833c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_49;
}

Assistant:

bool QCalendarTextNavigator::eventFilter(QObject *o, QEvent *e)
{
    if (m_widget) {
        if (e->type() == QEvent::KeyPress || e->type() == QEvent::KeyRelease) {
            QKeyEvent *ke = static_cast<QKeyEvent *>(e);
            if ((ke->text().size() > 0 && ke->text().at(0).isPrint()) || m_dateFrame) {
                if (ke->key() == Qt::Key_Return || ke->key() == Qt::Key_Enter || ke->key() == Qt::Key_Select) {
                    applyDate();
                    emit editingFinished();
                    removeDateLabel();
#if QT_CONFIG(shortcut)
                } else if (ke->matches(QKeySequence::Cancel)) {
                    removeDateLabel();
#endif
                } else if (e->type() == QEvent::KeyPress) {
                    createDateLabel();
                    m_dateValidator->handleKeyEvent(ke, m_calendar);
                    updateDateLabel();
                }
                ke->accept();
                return true;
            }
            // If we are navigating let the user finish his date in old locate.
            // If we change our mind and want it to update immediately simply uncomment below
            /*
        } else if (e->type() == QEvent::LocaleChange) {
            if (m_dateValidator) {
                m_dateValidator->setLocale(m_widget->locale());
                m_dateValidator->setFormat(m_widget->locale().dateFormat(QLocale::ShortFormat));
                updateDateLabel();
            }
            */
        }
    }
    return QObject::eventFilter(o,e);
}